

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

void __thiscall helics::MultiBroker::removeRoute(MultiBroker *this,route_id rid)

{
  const_iterator __position;
  bool bVar1;
  pointer this_00;
  BaseType in_ESI;
  __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
  *in_RDI;
  iterator it;
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  route_id rVar2;
  __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
  local_18 [2];
  route_id local_4;
  
  local_4.rid = in_ESI;
  local_18[0]._M_current =
       (pair<helics::route_id,_int> *)
       CLI::std::
       vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    CLI::std::
    vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
    end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::
            operator==<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                      (in_RDI,(__normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
              ::operator->(local_18);
    rVar2.rid = local_4.rid;
    bVar1 = route_id::operator==(&this_00->first,local_4);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
    ::operator++(local_18);
  }
  __gnu_cxx::
  __normal_iterator<std::pair<helics::route_id,int>const*,std::vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>>
  ::__normal_iterator<std::pair<helics::route_id,int>*>
            ((__normal_iterator<const_std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
              *)in_RDI,
             (__normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
              *)((__normal_iterator<const_std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                  *)in_RDI + 0x1f6));
  __position._M_current._4_4_ = rVar2.rid;
  __position._M_current._0_4_ = in_stack_ffffffffffffffd8;
  CLI::std::
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
  erase(in_stack_ffffffffffffffd0,__position);
  return;
}

Assistant:

void MultiBroker::removeRoute(route_id rid)
{
    for (auto it = routingTable.begin(); it != routingTable.end(); ++it) {
        if (it->first == rid) {
            routingTable.erase(it);
            return;
        }
    }
}